

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

bool __thiscall LowererMD::GenerateFastNeg(LowererMD *this,Instr *instrNeg)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  IRType IVar5;
  int32 iVar6;
  Opnd *pOVar7;
  undefined4 *puVar8;
  Opnd *pOVar9;
  RegOpnd *pRVar10;
  LabelInstr *labelHelper_00;
  Instr *pIVar11;
  BranchInstr *pBVar12;
  LabelInstr *branchTarget;
  bool isInt;
  IntConstType value;
  Opnd *newOpnd;
  RegOpnd *pRStack_48;
  bool usingNewDst;
  Opnd *opndDst;
  Opnd *opndSrc1;
  LabelInstr *labelFallThru;
  LabelInstr *labelHelper;
  Instr *instr;
  Instr *instrNeg_local;
  LowererMD *this_local;
  
  pOVar7 = IR::Instr::GetSrc1(instrNeg);
  if (pOVar7 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0xe09,"(opndSrc1)","Expected src opnd on Neg instruction");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  pOVar9 = IR::Instr::GetDst(instrNeg);
  bVar2 = IR::Opnd::IsEqual(pOVar7,pOVar9);
  if (bVar2) {
    pRStack_48 = IR::RegOpnd::New(TyInt32,this->m_func);
  }
  else {
    pOVar9 = IR::Instr::GetDst(instrNeg);
    pRStack_48 = (RegOpnd *)IR::Opnd::UseWithNewType(pOVar9,TyInt32,this->m_func);
  }
  bVar3 = IR::Opnd::IsRegOpnd(pOVar7);
  if (bVar3) {
    pRVar10 = IR::Opnd::AsRegOpnd(pOVar7);
    bVar3 = StackSym::IsIntConst(pRVar10->m_sym);
    if (bVar3) {
      pRVar10 = IR::Opnd::AsRegOpnd(pOVar7);
      iVar6 = StackSym::GetIntConstValue(pRVar10->m_sym);
      if ((long)iVar6 == 0) {
        value = (IntConstType)
                Lowerer::LoadLibraryValueOpnd(this->m_lowerer,instrNeg,ValueNegativeZero);
      }
      else {
        value = (IntConstType)IR::AddrOpnd::NewFromNumber(-(long)iVar6,this->m_func,false);
      }
      IR::Instr::ClearBailOutInfo(instrNeg);
      IR::Instr::FreeSrc1(instrNeg);
      IR::Instr::SetSrc1(instrNeg,(Opnd *)value);
      ChangeToAssign(instrNeg);
      return false;
    }
  }
  bVar3 = IR::Opnd::IsTaggedInt(pOVar7);
  bVar4 = IR::Opnd::IsRegOpnd(pOVar7);
  if (bVar4) {
    pRVar10 = IR::Opnd::AsRegOpnd(pOVar7);
    bVar4 = IR::Opnd::IsNotInt(&pRVar10->super_Opnd);
    if (bVar4) {
      return true;
    }
  }
  labelHelper_00 = IR::LabelInstr::New(Label,this->m_func,true);
  if (!bVar3) {
    GenerateSmIntTest(this,pOVar7,instrNeg,labelHelper_00,(Instr **)0x0,false);
  }
  pOVar7 = IR::Opnd::UseWithNewType(pOVar7,TyInt32,this->m_func);
  GenerateTaggedZeroTest(this,pOVar7,instrNeg,labelHelper_00);
  pIVar11 = IR::Instr::New(MOV,&pRStack_48->super_Opnd,pOVar7,this->m_func);
  IR::Instr::InsertBefore(instrNeg,pIVar11);
  pIVar11 = IR::Instr::New(NEG,&pRStack_48->super_Opnd,&pRStack_48->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instrNeg,pIVar11);
  pBVar12 = IR::BranchInstr::New(JO,labelHelper_00,this->m_func);
  IR::Instr::InsertBefore(instrNeg,&pBVar12->super_Instr);
  IVar5 = IR::Opnd::GetType(&pRStack_48->super_Opnd);
  if (IVar5 != TyInt64) {
    pRStack_48 = (RegOpnd *)IR::Opnd::UseWithNewType(&pRStack_48->super_Opnd,TyUint64,this->m_func);
  }
  GenerateInt32ToVarConversion(this,&pRStack_48->super_Opnd,instrNeg);
  if (bVar2) {
    pOVar7 = IR::Instr::GetDst(instrNeg);
    pIVar11 = IR::Instr::New(MOV,pOVar7,&pRStack_48->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instrNeg,pIVar11);
  }
  branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
  pBVar12 = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
  IR::Instr::InsertBefore(instrNeg,&pBVar12->super_Instr);
  if (labelHelper_00 == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0xe73,"(labelHelper)","Should not be NULL");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  IR::Instr::InsertBefore(instrNeg,&labelHelper_00->super_Instr);
  IR::Instr::InsertAfter(instrNeg,&branchTarget->super_Instr);
  return true;
}

Assistant:

bool
LowererMD::GenerateFastNeg(IR::Instr * instrNeg)
{
    // Given:
    //
    // dst = Not src
    //
    // Generate:
    //
    //       if not int, jump $helper
    //       if src == 0    -- test for zero (must be handled by the runtime to preserve
    //       JEQ $helper          difference btw +0 and -0)
    // dst = MOV src
    // dst = NEG dst        -- do an inline NEG
    // dst = ADD dst, 2     -- restore the var tag on the result             [int31 only]
    //       JO $helper
    // dst = OR dst, AtomTag_Ptr                                             [int32 only]
    //       JMP $fallthru
    // $helper:
    //      (caller generates helper call)
    // $fallthru:

    IR::Instr *      instr;
    IR::LabelInstr * labelHelper = nullptr;
    IR::LabelInstr * labelFallThru = nullptr;
    IR::Opnd *       opndSrc1;
    IR::Opnd *       opndDst;
    bool usingNewDst = false;
    opndSrc1 = instrNeg->GetSrc1();
    AssertMsg(opndSrc1, "Expected src opnd on Neg instruction");

    if(opndSrc1->IsEqual(instrNeg->GetDst()))
    {
        usingNewDst = true;
        opndDst = IR::RegOpnd::New(TyInt32, this->m_func);
    }
    else
    {
        opndDst = instrNeg->GetDst()->UseWithNewType(TyInt32, this->m_func);
    }

    if (opndSrc1->IsRegOpnd() && opndSrc1->AsRegOpnd()->m_sym->IsIntConst())
    {
        IR::Opnd *newOpnd;
        IntConstType value = opndSrc1->AsRegOpnd()->m_sym->GetIntConstValue();

        if (value == 0)
        {
            // If the negate operand is zero, the result is -0.0, which is a Number rather than an Int31.
            newOpnd = m_lowerer->LoadLibraryValueOpnd(instrNeg, LibraryValue::ValueNegativeZero);
        }
        else
        {
            // negation below can overflow because max negative int32 value > max positive value by 1.
            newOpnd = IR::AddrOpnd::NewFromNumber(-(int64)value, m_func);
        }

        instrNeg->ClearBailOutInfo();
        instrNeg->FreeSrc1();
        instrNeg->SetSrc1(newOpnd);
        instrNeg = this->ChangeToAssign(instrNeg);

        // Skip lowering call to helper
        return false;
    }

    bool isInt = (opndSrc1->IsTaggedInt());

    if (opndSrc1->IsRegOpnd() && opndSrc1->AsRegOpnd()->IsNotInt())
    {
        return true;
    }

    labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    if (!isInt)
    {
        GenerateSmIntTest(opndSrc1, instrNeg, labelHelper);
    }

    //
    // For 32 bit arithmetic we copy them and set the size of operands to be 32 bits. This is
    // relevant only on AMD64.
    //
    opndSrc1    = opndSrc1->UseWithNewType(TyInt32, this->m_func);
    GenerateTaggedZeroTest(opndSrc1, instrNeg, labelHelper);

    // dst = MOV src

    instr = IR::Instr::New(Js::OpCode::MOV, opndDst, opndSrc1, this->m_func);
    instrNeg->InsertBefore(instr);

    // dst = NEG dst

    instr = IR::Instr::New(Js::OpCode::NEG, opndDst, opndDst, this->m_func);
    instrNeg->InsertBefore(instr);

#if !INT32VAR
    // dst = ADD dst, 2

    instr = IR::Instr::New(Js::OpCode::ADD, opndDst, opndDst, IR::IntConstOpnd::New(2, TyInt32, this->m_func), this->m_func);
    instrNeg->InsertBefore(instr);
#endif

    // JO $helper

    instr = IR::BranchInstr::New(Js::OpCode::JO, labelHelper, this->m_func);
    instrNeg->InsertBefore(instr);

    //
    // Convert TyInt32 operand, back to TyMachPtr type.
    //
    if(TyMachReg != opndDst->GetType())
    {
        opndDst = opndDst->UseWithNewType(TyMachPtr, this->m_func);
    }

#if INT32VAR
    GenerateInt32ToVarConversion(opndDst, instrNeg);
#endif
    if(usingNewDst)
    {
        instr = IR::Instr::New(Js::OpCode::MOV, instrNeg->GetDst(), opndDst, this->m_func);
        instrNeg->InsertBefore(instr);
    }

    // JMP $fallthru

    labelFallThru = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instr = IR::BranchInstr::New(Js::OpCode::JMP, labelFallThru, this->m_func);
    instrNeg->InsertBefore(instr);

    // $helper:
    //      (caller generates helper sequence)
    // $fallthru:

    AssertMsg(labelHelper, "Should not be NULL");
    instrNeg->InsertBefore(labelHelper);
    instrNeg->InsertAfter(labelFallThru);

    return true;
}